

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

lys_restr * lys_restr_dup(lys_module *mod,lys_restr *old,int size,unres_schema *unres)

{
  uint8_t size_00;
  lys_restr *plVar1;
  char *pcVar2;
  LY_ERR *pLVar3;
  lys_restr *parent;
  long lVar4;
  
  if (size == 0) {
    return (lys_restr *)0x0;
  }
  plVar1 = (lys_restr *)calloc((long)size,0x38);
  if (plVar1 == (lys_restr *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_restr_dup");
    plVar1 = (lys_restr *)0x0;
  }
  else if (0 < size) {
    lVar4 = 0;
    parent = plVar1;
    do {
      size_00 = (&old->ext_size)[lVar4];
      parent->ext_size = size_00;
      lys_ext_dup(mod,*(lys_ext_instance ***)((long)&old->ext + lVar4),size_00,parent,
                  LYEXT_PAR_RESTR,&parent->ext,unres);
      pcVar2 = lydict_insert(mod->ctx,*(char **)((long)&old->expr + lVar4),0);
      parent->expr = pcVar2;
      pcVar2 = lydict_insert(mod->ctx,*(char **)((long)&old->dsc + lVar4),0);
      parent->dsc = pcVar2;
      pcVar2 = lydict_insert(mod->ctx,*(char **)((long)&old->ref + lVar4),0);
      parent->ref = pcVar2;
      pcVar2 = lydict_insert(mod->ctx,*(char **)((long)&old->eapptag + lVar4),0);
      parent->eapptag = pcVar2;
      pcVar2 = lydict_insert(mod->ctx,*(char **)((long)&old->emsg + lVar4),0);
      parent->emsg = pcVar2;
      parent = parent + 1;
      lVar4 = lVar4 + 0x38;
    } while ((ulong)(uint)size * 0x38 != lVar4);
  }
  return plVar1;
}

Assistant:

static struct lys_restr *
lys_restr_dup(struct lys_module *mod, struct lys_restr *old, int size, struct unres_schema *unres)
{
    struct lys_restr *result;
    int i;

    if (!size) {
        return NULL;
    }

    result = calloc(size, sizeof *result);
    if (!result) {
        LOGMEM;
        return NULL;
    }
    for (i = 0; i < size; i++) {
        result[i].ext_size = old[i].ext_size;
        lys_ext_dup(mod, old[i].ext, old[i].ext_size, &result[i], LYEXT_PAR_RESTR, &result[i].ext, unres);
        result[i].expr = lydict_insert(mod->ctx, old[i].expr, 0);
        result[i].dsc = lydict_insert(mod->ctx, old[i].dsc, 0);
        result[i].ref = lydict_insert(mod->ctx, old[i].ref, 0);
        result[i].eapptag = lydict_insert(mod->ctx, old[i].eapptag, 0);
        result[i].emsg = lydict_insert(mod->ctx, old[i].emsg, 0);
    }

    return result;
}